

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O1

void __thiscall HRSS_Basic_Test::TestBody(HRSS_Basic_Test *this)

{
  uint i;
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  uint8_t shared_key2 [32];
  uint8_t shared_key [32];
  uint8_t ciphertext [1138];
  uint8_t encap_entropy [1400];
  HRSS_public_key pub2;
  uint8_t pub_bytes [1138];
  HRSS_public_key pub;
  uint8_t generate_key_entropy [1432];
  HRSS_private_key priv;
  undefined1 local_26e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_26d8;
  Bytes local_26d0;
  undefined1 local_26c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_26b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_26b0;
  AssertHelper local_26a0;
  string local_2698;
  internal local_2678 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2670 [3];
  undefined1 local_2658 [1152];
  internal local_21d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_21d0 [175];
  undefined1 local_1c58 [1424];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_16c8 [144];
  HRSS_public_key local_1248;
  uint8_t local_cb8 [1432];
  HRSS_private_key local_720;
  
  lVar2 = 0;
  do {
    local_cb8[lVar2] = (uint8_t)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x598);
  iVar1 = HRSS_generate_key(&local_1248,&local_720,local_cb8);
  local_21d8[0] = (internal)(iVar1 != 0);
  local_21d0[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_21d0;
    testing::Message::Message((Message *)local_16c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c58,local_21d8,
               (AssertionResult *)"HRSS_generate_key(&pub, &priv, generate_key_entropy)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2658,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x92,(char *)local_1c58._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2658,(Message *)local_16c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2658);
    if ((undefined1 *)local_1c58._0_8_ != local_1c58 + 0x10) {
      operator_delete((void *)local_1c58._0_8_,local_1c58._16_8_ + 1);
    }
    __ptr_00 = local_21d0[0];
    if (local_16c8[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_16c8[0]._M_head_impl + 8))();
      __ptr_00 = local_21d0[0];
    }
  }
  else {
    lVar2 = 0;
    do {
      local_21d8[lVar2] = SUB81(lVar2,0);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x578);
    HRSS_marshal_public_key((uint8_t *)local_16c8,&local_1248);
    iVar1 = HRSS_parse_public_key((HRSS_public_key *)local_1c58,(uint8_t *)local_16c8);
    local_2678[0] = (internal)(iVar1 != 0);
    local_2670[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_2670;
      testing::Message::Message((Message *)&local_2698);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_2658,local_2678,
                 (AssertionResult *)"HRSS_parse_public_key(&pub2, pub_bytes)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_26c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x9c,(char *)local_2658._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_26c0,(Message *)&local_2698);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_26c0);
      if ((AssertHelperData *)local_2658._0_8_ != (AssertHelperData *)(local_2658 + 0x10)) {
        operator_delete((void *)local_2658._0_8_,local_2658._16_8_ + 1);
      }
      __ptr_00 = local_2670[0];
      if ((long *)local_2698._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_2698._M_dataplus._M_p + 8))();
        __ptr_00 = local_2670[0];
      }
    }
    else {
      iVar1 = HRSS_encap(local_2658,(uint8_t *)local_2678,(HRSS_public_key *)local_1c58,
                         (uint8_t *)local_21d8);
      local_26c0[0] = (internal)(iVar1 != 0);
      local_26b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_26b8;
        testing::Message::Message((Message *)local_26e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2698,(internal *)local_26c0,
                   (AssertionResult *)"HRSS_encap(ciphertext, shared_key, &pub2, encap_entropy)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_26d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xa0,local_2698._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_26d0,(Message *)local_26e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_26d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2698._M_dataplus._M_p != &local_2698.field_2) {
          operator_delete(local_2698._M_dataplus._M_p,local_2698.field_2._M_allocated_capacity + 1);
        }
        __ptr_00 = local_26b8;
        if (local_26e0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_26e0 + 8))();
          __ptr_00 = local_26b8;
        }
      }
      else {
        iVar1 = HRSS_decap((uint8_t *)&local_2698,&local_720,local_2658,0x472);
        local_26e0[0] = iVar1 != 0;
        local_26d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 != 0) {
          local_26d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &DAT_00000020;
          local_26d0.span_.size_ = 0x20;
          local_26e0 = (undefined1  [8])local_2678;
          local_26d0.span_.data_ = (uchar *)&local_2698;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_26c0,"Bytes(shared_key)","Bytes(shared_key2)",
                     (Bytes *)local_26e0,&local_26d0);
          if (local_26c0[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_26e0);
            if (local_26b8 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message = "";
            }
            else {
              message = (local_26b8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_26d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                       ,0xa5,message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_26d0,(Message *)local_26e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_26d0);
            if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_26e0 !=
                (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0) {
              (**(code **)(*(long *)local_26e0 + 8))();
            }
          }
          if (local_26b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            return;
          }
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_26b8;
          __ptr_00 = local_26b8;
          goto LAB_0031b743;
        }
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_26d8;
        testing::Message::Message((Message *)&local_26d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_26c0,(internal *)local_26e0,
                   (AssertionResult *)
                   "HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext))","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_26a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xa3,(char *)CONCAT71(local_26c0._1_7_,local_26c0[0]));
        testing::internal::AssertHelper::operator=(&local_26a0,(Message *)&local_26d0);
        testing::internal::AssertHelper::~AssertHelper(&local_26a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_26c0._1_7_,local_26c0[0]) != &local_26b0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_26c0._1_7_,local_26c0[0]),
                          local_26b0._M_allocated_capacity + 1);
        }
        __ptr_00 = local_26d8;
        if ((string *)local_26d0.span_.data_ != (string *)0x0) {
          (**(code **)(((_Alloc_hider *)local_26d0.span_.data_)->_M_p + 8))();
          __ptr_00 = local_26d8;
        }
      }
    }
  }
  if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
LAB_0031b743:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
  return;
}

Assistant:

TEST(HRSS, Basic) {
  uint8_t generate_key_entropy[HRSS_GENERATE_KEY_BYTES];
  for (unsigned i = 0; i < sizeof(generate_key_entropy); i++) {
    generate_key_entropy[i] = i;
  }

  HRSS_public_key pub;
  HRSS_private_key priv;
  ASSERT_TRUE(HRSS_generate_key(&pub, &priv, generate_key_entropy));

  uint8_t encap_entropy[HRSS_ENCAP_BYTES];
  for (unsigned i = 0; i < sizeof(encap_entropy); i++) {
    encap_entropy[i] = i;
  }

  HRSS_public_key pub2;
  uint8_t pub_bytes[HRSS_PUBLIC_KEY_BYTES];
  HRSS_marshal_public_key(pub_bytes, &pub);
  ASSERT_TRUE(HRSS_parse_public_key(&pub2, pub_bytes));

  uint8_t ciphertext[HRSS_CIPHERTEXT_BYTES];
  uint8_t shared_key[HRSS_KEY_BYTES];
  ASSERT_TRUE(HRSS_encap(ciphertext, shared_key, &pub2, encap_entropy));

  uint8_t shared_key2[HRSS_KEY_BYTES];
  ASSERT_TRUE(HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext)));

  EXPECT_EQ(Bytes(shared_key), Bytes(shared_key2));
}